

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestInterface.cpp
# Opt level: O0

void RunUtilityTests(void)

{
  uint uVar1;
  uint *puVar2;
  uint local_54;
  uint local_50;
  uint i_3;
  uint i_2;
  FastVector<unsigned_int,_false,_false> arr_1;
  uint local_30;
  uint i_1;
  uint i;
  uint local_1c;
  undefined1 local_18 [8];
  FastVector<unsigned_int,_false,_false> arr;
  
  if ((Tests::messageVerbose & 1) != 0) {
    printf("FastVector test 1\r\n");
  }
  testsCount[3] = testsCount[3] + 1;
  FastVector<unsigned_int,_false,_false>::FastVector
            ((FastVector<unsigned_int,_false,_false> *)local_18);
  local_1c = 1;
  FastVector<unsigned_int,_false,_false>::push_back
            ((FastVector<unsigned_int,_false,_false> *)local_18,&local_1c);
  for (local_30 = 0; local_30 < 0x400; local_30 = local_30 + 1) {
    uVar1 = FastVector<unsigned_int,_false,_false>::size
                      ((FastVector<unsigned_int,_false,_false> *)local_18);
    puVar2 = FastVector<unsigned_int,_false,_false>::operator[]
                       ((FastVector<unsigned_int,_false,_false> *)local_18,uVar1 - 1);
    FastVector<unsigned_int,_false,_false>::push_back
              ((FastVector<unsigned_int,_false,_false> *)local_18,puVar2);
    puVar2 = FastVector<unsigned_int,_false,_false>::back
                       ((FastVector<unsigned_int,_false,_false> *)local_18);
    *puVar2 = *puVar2 + 1;
  }
  for (arr_1.count = 0; arr_1.count < 0x400; arr_1.count = arr_1.count + 1) {
    puVar2 = FastVector<unsigned_int,_false,_false>::operator[]
                       ((FastVector<unsigned_int,_false,_false> *)local_18,arr_1.count);
    if (*puVar2 != arr_1.count + 1) {
      if ((Tests::messageVerbose & 1) == 0) {
        printf("FastVector test 1\r\n");
      }
      puVar2 = FastVector<unsigned_int,_false,_false>::operator[]
                         ((FastVector<unsigned_int,_false,_false> *)local_18,arr_1.count);
      printf("Failed %d != %d\n",(ulong)*puVar2,(ulong)(arr_1.count + 1));
      arr_1.max = 1;
      goto LAB_0017b8af;
    }
  }
  testsPassed[3] = testsPassed[3] + 1;
  arr_1.max = 0;
LAB_0017b8af:
  FastVector<unsigned_int,_false,_false>::~FastVector
            ((FastVector<unsigned_int,_false,_false> *)local_18);
  if (arr_1.max == 0) {
    if ((Tests::messageVerbose & 1) != 0) {
      printf("FastVector test 2\r\n");
    }
    testsCount[3] = testsCount[3] + 1;
    FastVector<unsigned_int,_false,_false>::FastVector
              ((FastVector<unsigned_int,_false,_false> *)&i_2);
    i_3 = 1;
    FastVector<unsigned_int,_false,_false>::push_back
              ((FastVector<unsigned_int,_false,_false> *)&i_2,&i_3);
    for (local_50 = 0; local_50 < 0x400; local_50 = local_50 + 1) {
      uVar1 = FastVector<unsigned_int,_false,_false>::size
                        ((FastVector<unsigned_int,_false,_false> *)&i_2);
      puVar2 = FastVector<unsigned_int,_false,_false>::operator[]
                         ((FastVector<unsigned_int,_false,_false> *)&i_2,uVar1 - 1);
      FastVector<unsigned_int,_false,_false>::push_back
                ((FastVector<unsigned_int,_false,_false> *)&i_2,puVar2);
      puVar2 = FastVector<unsigned_int,_false,_false>::back
                         ((FastVector<unsigned_int,_false,_false> *)&i_2);
      *puVar2 = *puVar2 + 1;
    }
    for (local_54 = 0; local_54 < 0x400; local_54 = local_54 + 1) {
      puVar2 = FastVector<unsigned_int,_false,_false>::operator[]
                         ((FastVector<unsigned_int,_false,_false> *)&i_2,local_54);
      if (*puVar2 != local_54 + 1) {
        if ((Tests::messageVerbose & 1) == 0) {
          printf("FastVector test 2\r\n");
        }
        puVar2 = FastVector<unsigned_int,_false,_false>::operator[]
                           ((FastVector<unsigned_int,_false,_false> *)&i_2,local_54);
        printf("Failed %d != %d\n",(ulong)*puVar2,(ulong)(local_54 + 1));
        arr_1.max = 1;
        goto LAB_0017ba72;
      }
    }
    testsPassed[3] = testsPassed[3] + 1;
    arr_1.max = 0;
LAB_0017ba72:
    FastVector<unsigned_int,_false,_false>::~FastVector
              ((FastVector<unsigned_int,_false,_false> *)&i_2);
  }
  return;
}

Assistant:

void RunUtilityTests()
{
	{
		if(Tests::messageVerbose)
			printf("FastVector test 1\r\n");

		testsCount[TEST_TYPE_EXTRA]++;

		FastVector<unsigned> arr;

		arr.push_back(1);

		for(unsigned i = 0; i < 1024; i++)
		{
			arr.push_back(arr[arr.size() - 1]);
			arr.back()++;
		}

		for(unsigned i = 0; i < 1024; i++)
		{
			if(arr[i] != i + 1)
			{
				if(!Tests::messageVerbose)
					printf("FastVector test 1\r\n");

				printf("Failed %d != %d\n", arr[i], i + 1);
				return;
			}
		}

		testsPassed[TEST_TYPE_EXTRA]++;
	}

	{
		if(Tests::messageVerbose)
			printf("FastVector test 2\r\n");

		testsCount[TEST_TYPE_EXTRA]++;

		FastVector<unsigned> arr;

		arr.push_back(1);

		for(unsigned i = 0; i < 1024; i++)
		{
			arr.push_back(arr[arr.size() - 1]);
			arr.back()++;
		}

		for(unsigned i = 0; i < 1024; i++)
		{
			if(arr[i] != i + 1)
			{
				if(!Tests::messageVerbose)
					printf("FastVector test 2\r\n");

				printf("Failed %d != %d\n", arr[i], i + 1);
				return;
			}
		}

		testsPassed[TEST_TYPE_EXTRA]++;
	}
}